

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O0

mat<double,_4,_4> *
linalg::adjugate<double>(mat<double,_4,_4> *__return_storage_ptr__,mat<double,_4,_4> *a)

{
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  vec<double,_4> local_f0;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  vec<double,_4> local_b0;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  vec<double,_4> local_70;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  vec<double,_4> local_30;
  mat<double,_4,_4> *local_10;
  mat<double,_4,_4> *a_local;
  
  local_38 = -((a->w).y * (a->z).z) * (a->y).w +
             -((a->z).y * (a->y).z) * (a->w).w +
             -((a->y).y * (a->w).z) * (a->z).w +
             (a->z).y * (a->w).z * (a->y).w +
             (a->y).y * (a->z).z * (a->w).w + (a->w).y * (a->y).z * (a->z).w;
  local_40 = -((a->x).y * (a->z).z) * (a->w).w +
             -((a->z).y * (a->w).z) * (a->x).w +
             -((a->w).y * (a->x).z) * (a->z).w +
             (a->w).y * (a->z).z * (a->x).w +
             (a->x).y * (a->w).z * (a->z).w + (a->z).y * (a->x).z * (a->w).w;
  local_48 = -((a->w).y * (a->y).z) * (a->x).w +
             -((a->y).y * (a->x).z) * (a->w).w +
             -((a->x).y * (a->w).z) * (a->y).w +
             (a->y).y * (a->w).z * (a->x).w +
             (a->x).y * (a->y).z * (a->w).w + (a->w).y * (a->x).z * (a->y).w;
  local_50 = -((a->y).y * (a->z).z) * (a->x).w +
             -((a->z).y * (a->x).z) * (a->y).w +
             -((a->x).y * (a->y).z) * (a->z).w +
             (a->z).y * (a->y).z * (a->x).w +
             (a->x).y * (a->z).z * (a->y).w + (a->y).y * (a->x).z * (a->z).w;
  local_10 = a;
  vec<double,_4>::vec(&local_30,&local_38,&local_40,&local_48,&local_50);
  local_78 = -((local_10->z).z * (local_10->w).w) * (local_10->y).x +
             -((local_10->w).z * (local_10->y).w) * (local_10->z).x +
             -((local_10->y).z * (local_10->z).w) * (local_10->w).x +
             (local_10->w).z * (local_10->z).w * (local_10->y).x +
             (local_10->y).z * (local_10->w).w * (local_10->z).x +
             (local_10->z).z * (local_10->y).w * (local_10->w).x;
  local_80 = -((local_10->w).z * (local_10->z).w) * (local_10->x).x +
             -((local_10->z).z * (local_10->x).w) * (local_10->w).x +
             -((local_10->x).z * (local_10->w).w) * (local_10->z).x +
             (local_10->z).z * (local_10->w).w * (local_10->x).x +
             (local_10->x).z * (local_10->z).w * (local_10->w).x +
             (local_10->w).z * (local_10->x).w * (local_10->z).x;
  local_88 = -((local_10->y).z * (local_10->w).w) * (local_10->x).x +
             -((local_10->w).z * (local_10->x).w) * (local_10->y).x +
             -((local_10->x).z * (local_10->y).w) * (local_10->w).x +
             (local_10->w).z * (local_10->y).w * (local_10->x).x +
             (local_10->x).z * (local_10->w).w * (local_10->y).x +
             (local_10->y).z * (local_10->x).w * (local_10->w).x;
  local_90 = -((local_10->z).z * (local_10->y).w) * (local_10->x).x +
             -((local_10->y).z * (local_10->x).w) * (local_10->z).x +
             -((local_10->x).z * (local_10->z).w) * (local_10->y).x +
             (local_10->y).z * (local_10->z).w * (local_10->x).x +
             (local_10->x).z * (local_10->y).w * (local_10->z).x +
             (local_10->z).z * (local_10->x).w * (local_10->y).x;
  vec<double,_4>::vec(&local_70,&local_78,&local_80,&local_88,&local_90);
  local_b8 = -((local_10->w).w * (local_10->z).x) * (local_10->y).y +
             -((local_10->z).w * (local_10->y).x) * (local_10->w).y +
             -((local_10->y).w * (local_10->w).x) * (local_10->z).y +
             (local_10->z).w * (local_10->w).x * (local_10->y).y +
             (local_10->y).w * (local_10->z).x * (local_10->w).y +
             (local_10->w).w * (local_10->y).x * (local_10->z).y;
  local_c0 = -((local_10->z).w * (local_10->w).x) * (local_10->x).y +
             -((local_10->w).w * (local_10->x).x) * (local_10->z).y +
             -((local_10->x).w * (local_10->z).x) * (local_10->w).y +
             (local_10->w).w * (local_10->z).x * (local_10->x).y +
             (local_10->x).w * (local_10->w).x * (local_10->z).y +
             (local_10->z).w * (local_10->x).x * (local_10->w).y;
  local_c8 = -((local_10->w).w * (local_10->y).x) * (local_10->x).y +
             -((local_10->y).w * (local_10->x).x) * (local_10->w).y +
             -((local_10->x).w * (local_10->w).x) * (local_10->y).y +
             (local_10->y).w * (local_10->w).x * (local_10->x).y +
             (local_10->x).w * (local_10->y).x * (local_10->w).y +
             (local_10->w).w * (local_10->x).x * (local_10->y).y;
  local_d0 = -((local_10->y).w * (local_10->z).x) * (local_10->x).y +
             -((local_10->z).w * (local_10->x).x) * (local_10->y).y +
             -((local_10->x).w * (local_10->y).x) * (local_10->z).y +
             (local_10->z).w * (local_10->y).x * (local_10->x).y +
             (local_10->x).w * (local_10->z).x * (local_10->y).y +
             (local_10->y).w * (local_10->x).x * (local_10->z).y;
  vec<double,_4>::vec(&local_b0,&local_b8,&local_c0,&local_c8,&local_d0);
  local_f8 = -((local_10->z).x * (local_10->w).y) * (local_10->y).z +
             -((local_10->w).x * (local_10->y).y) * (local_10->z).z +
             -((local_10->y).x * (local_10->z).y) * (local_10->w).z +
             (local_10->w).x * (local_10->z).y * (local_10->y).z +
             (local_10->y).x * (local_10->w).y * (local_10->z).z +
             (local_10->z).x * (local_10->y).y * (local_10->w).z;
  local_100 = -((local_10->w).x * (local_10->z).y) * (local_10->x).z +
              -((local_10->z).x * (local_10->x).y) * (local_10->w).z +
              -((local_10->x).x * (local_10->w).y) * (local_10->z).z +
              (local_10->z).x * (local_10->w).y * (local_10->x).z +
              (local_10->x).x * (local_10->z).y * (local_10->w).z +
              (local_10->w).x * (local_10->x).y * (local_10->z).z;
  local_108 = -((local_10->y).x * (local_10->w).y) * (local_10->x).z +
              -((local_10->w).x * (local_10->x).y) * (local_10->y).z +
              -((local_10->x).x * (local_10->y).y) * (local_10->w).z +
              (local_10->w).x * (local_10->y).y * (local_10->x).z +
              (local_10->x).x * (local_10->w).y * (local_10->y).z +
              (local_10->y).x * (local_10->x).y * (local_10->w).z;
  local_110 = -((local_10->z).x * (local_10->y).y) * (local_10->x).z +
              -((local_10->y).x * (local_10->x).y) * (local_10->z).z +
              -((local_10->x).x * (local_10->z).y) * (local_10->y).z +
              (local_10->y).x * (local_10->z).y * (local_10->x).z +
              (local_10->x).x * (local_10->y).y * (local_10->z).z +
              (local_10->z).x * (local_10->x).y * (local_10->y).z;
  vec<double,_4>::vec(&local_f0,&local_f8,&local_100,&local_108,&local_110);
  mat<double,_4,_4>::mat(__return_storage_ptr__,&local_30,&local_70,&local_b0,&local_f0);
  return __return_storage_ptr__;
}

Assistant:

constexpr linalg::mat<T,4,4> linalg::adjugate(const mat<T,4,4> & a) 
{
    return {{a.y.y*a.z.z*a.w.w + a.w.y*a.y.z*a.z.w + a.z.y*a.w.z*a.y.w - a.y.y*a.w.z*a.z.w - a.z.y*a.y.z*a.w.w - a.w.y*a.z.z*a.y.w,
             a.x.y*a.w.z*a.z.w + a.z.y*a.x.z*a.w.w + a.w.y*a.z.z*a.x.w - a.w.y*a.x.z*a.z.w - a.z.y*a.w.z*a.x.w - a.x.y*a.z.z*a.w.w,
             a.x.y*a.y.z*a.w.w + a.w.y*a.x.z*a.y.w + a.y.y*a.w.z*a.x.w - a.x.y*a.w.z*a.y.w - a.y.y*a.x.z*a.w.w - a.w.y*a.y.z*a.x.w,
             a.x.y*a.z.z*a.y.w + a.y.y*a.x.z*a.z.w + a.z.y*a.y.z*a.x.w - a.x.y*a.y.z*a.z.w - a.z.y*a.x.z*a.y.w - a.y.y*a.z.z*a.x.w},
            {a.y.z*a.w.w*a.z.x + a.z.z*a.y.w*a.w.x + a.w.z*a.z.w*a.y.x - a.y.z*a.z.w*a.w.x - a.w.z*a.y.w*a.z.x - a.z.z*a.w.w*a.y.x,
             a.x.z*a.z.w*a.w.x + a.w.z*a.x.w*a.z.x + a.z.z*a.w.w*a.x.x - a.x.z*a.w.w*a.z.x - a.z.z*a.x.w*a.w.x - a.w.z*a.z.w*a.x.x,
             a.x.z*a.w.w*a.y.x + a.y.z*a.x.w*a.w.x + a.w.z*a.y.w*a.x.x - a.x.z*a.y.w*a.w.x - a.w.z*a.x.w*a.y.x - a.y.z*a.w.w*a.x.x,
             a.x.z*a.y.w*a.z.x + a.z.z*a.x.w*a.y.x + a.y.z*a.z.w*a.x.x - a.x.z*a.z.w*a.y.x - a.y.z*a.x.w*a.z.x - a.z.z*a.y.w*a.x.x},
            {a.y.w*a.z.x*a.w.y + a.w.w*a.y.x*a.z.y + a.z.w*a.w.x*a.y.y - a.y.w*a.w.x*a.z.y - a.z.w*a.y.x*a.w.y - a.w.w*a.z.x*a.y.y,
             a.x.w*a.w.x*a.z.y + a.z.w*a.x.x*a.w.y + a.w.w*a.z.x*a.x.y - a.x.w*a.z.x*a.w.y - a.w.w*a.x.x*a.z.y - a.z.w*a.w.x*a.x.y,
             a.x.w*a.y.x*a.w.y + a.w.w*a.x.x*a.y.y + a.y.w*a.w.x*a.x.y - a.x.w*a.w.x*a.y.y - a.y.w*a.x.x*a.w.y - a.w.w*a.y.x*a.x.y,
             a.x.w*a.z.x*a.y.y + a.y.w*a.x.x*a.z.y + a.z.w*a.y.x*a.x.y - a.x.w*a.y.x*a.z.y - a.z.w*a.x.x*a.y.y - a.y.w*a.z.x*a.x.y},
            {a.y.x*a.w.y*a.z.z + a.z.x*a.y.y*a.w.z + a.w.x*a.z.y*a.y.z - a.y.x*a.z.y*a.w.z - a.w.x*a.y.y*a.z.z - a.z.x*a.w.y*a.y.z,
             a.x.x*a.z.y*a.w.z + a.w.x*a.x.y*a.z.z + a.z.x*a.w.y*a.x.z - a.x.x*a.w.y*a.z.z - a.z.x*a.x.y*a.w.z - a.w.x*a.z.y*a.x.z,
             a.x.x*a.w.y*a.y.z + a.y.x*a.x.y*a.w.z + a.w.x*a.y.y*a.x.z - a.x.x*a.y.y*a.w.z - a.w.x*a.x.y*a.y.z - a.y.x*a.w.y*a.x.z,
             a.x.x*a.y.y*a.z.z + a.z.x*a.x.y*a.y.z + a.y.x*a.z.y*a.x.z - a.x.x*a.z.y*a.y.z - a.y.x*a.x.y*a.z.z - a.z.x*a.y.y*a.x.z}}; 
}